

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_table_relation.cpp
# Opt level: O2

BoundStatement * __thiscall
duckdb::CreateTableRelation::Bind
          (BoundStatement *__return_storage_ptr__,CreateTableRelation *this,Binder *binder)

{
  OnCreateConflict OVar1;
  bool bVar2;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var3;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var4;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var5;
  _func_int **pp_Var6;
  unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> uVar7;
  Relation *pRVar8;
  pointer pSVar9;
  pointer pCVar10;
  CreateStatement stmt;
  _Head_base<0UL,_duckdb::CreateTableInfo_*,_false> local_b0;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> local_a8;
  CreateStatement local_a0;
  
  make_uniq<duckdb::SelectStatement>();
  pRVar8 = shared_ptr<duckdb::Relation,_true>::operator->(&this->child);
  (*pRVar8->_vptr_Relation[3])(&local_a0,pRVar8);
  pSVar9 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>::
           operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                       *)&local_a8);
  pp_Var6 = local_a0.super_SQLStatement._vptr_SQLStatement;
  local_a0.super_SQLStatement._vptr_SQLStatement = (_func_int **)0x0;
  _Var3._M_head_impl =
       (pSVar9->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
       _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
       super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
  (pSVar9->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
  super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)pp_Var6;
  if (_Var3._M_head_impl != (QueryNode *)0x0) {
    (**(code **)((long)(_Var3._M_head_impl)->_vptr_QueryNode + 8))();
    if (local_a0.super_SQLStatement._vptr_SQLStatement != (_func_int **)0x0) {
      (**(code **)(*local_a0.super_SQLStatement._vptr_SQLStatement + 8))();
    }
  }
  CreateStatement::CreateStatement(&local_a0);
  make_uniq<duckdb::CreateTableInfo>();
  pCVar10 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
            ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                          *)&local_b0);
  ::std::__cxx11::string::_M_assign((string *)&(pCVar10->super_CreateInfo).schema);
  pCVar10 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
            ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                          *)&local_b0);
  ::std::__cxx11::string::_M_assign((string *)&pCVar10->table);
  pCVar10 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
            ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                          *)&local_b0);
  _Var5._M_head_impl = local_a8._M_head_impl;
  local_a8._M_head_impl = (SelectStatement *)0x0;
  _Var4._M_head_impl =
       (pCVar10->query).
       super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
       .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
  (pCVar10->query).
  super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t.
  super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>.
  super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl = _Var5._M_head_impl;
  if (_Var4._M_head_impl != (SelectStatement *)0x0) {
    (**(code **)(*(long *)&(_Var4._M_head_impl)->super_SQLStatement + 8))();
  }
  OVar1 = this->on_conflict;
  pCVar10 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
            ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                          *)&local_b0);
  (pCVar10->super_CreateInfo).on_conflict = OVar1;
  bVar2 = this->temporary;
  pCVar10 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
            ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                          *)&local_b0);
  uVar7.super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
  super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl =
       (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)
       (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)local_a0.info;
  local_a0.info.super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
  super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl =
       (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)
       (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)
       local_b0._M_head_impl;
  (pCVar10->super_CreateInfo).temporary = bVar2;
  local_b0._M_head_impl = (CreateTableInfo *)0x0;
  if ((__uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)
      uVar7.super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
      super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
      super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)0x0) {
    (**(code **)(*(long *)uVar7.
                          super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>
                          .super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl + 8))();
  }
  Binder::Bind(__return_storage_ptr__,binder,&local_a0.super_SQLStatement);
  if (local_b0._M_head_impl != (CreateTableInfo *)0x0) {
    (*((local_b0._M_head_impl)->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[1])();
  }
  CreateStatement::~CreateStatement(&local_a0);
  if (local_a8._M_head_impl != (SelectStatement *)0x0) {
    (**(code **)((long)((local_a8._M_head_impl)->super_SQLStatement)._vptr_SQLStatement + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

BoundStatement CreateTableRelation::Bind(Binder &binder) {
	auto select = make_uniq<SelectStatement>();
	select->node = child->GetQueryNode();

	CreateStatement stmt;
	auto info = make_uniq<CreateTableInfo>();
	info->schema = schema_name;
	info->table = table_name;
	info->query = std::move(select);
	info->on_conflict = on_conflict;
	info->temporary = temporary;
	stmt.info = std::move(info);
	return binder.Bind(stmt.Cast<SQLStatement>());
}